

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::MemoryAllocator::MemoryAllocator
          (MemoryAllocator *this,EglTestContext *eglTestCtx,EGLDisplay display,EGLConfig config,
          int seed,ObjectType types,int minWidth,int minHeight,int maxWidth,int maxHeight,bool use)

{
  EglTestContext *this_00;
  ApiType apiType;
  bool use_local;
  ObjectType types_local;
  int seed_local;
  EGLConfig config_local;
  EGLDisplay display_local;
  EglTestContext *eglTestCtx_local;
  MemoryAllocator *this_local;
  
  this->m_eglTestCtx = eglTestCtx;
  this->m_display = display;
  this->m_config = config;
  glw::Functions::Functions(&this->m_gl);
  de::Random::Random(&this->m_rnd,seed);
  this->m_failed = false;
  std::__cxx11::string::string((string *)&this->m_errorString);
  this->m_types = types;
  this->m_minWidth = minWidth;
  this->m_minHeight = minHeight;
  this->m_maxWidth = maxWidth;
  this->m_maxHeight = maxHeight;
  this->m_use = use;
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_pbuffers);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_contexts);
  this_00 = this->m_eglTestCtx;
  apiType = glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,&this->m_gl,apiType);
  return;
}

Assistant:

MemoryAllocator::MemoryAllocator (EglTestContext& eglTestCtx, EGLDisplay display, EGLConfig config, int seed, ObjectType types, int minWidth, int minHeight, int maxWidth, int maxHeight, bool use)
	: m_eglTestCtx	(eglTestCtx)
	, m_display		(display)
	, m_config		(config)

	, m_rnd			(seed)
	, m_failed		(false)

	, m_types		(types)
	, m_minWidth	(minWidth)
	, m_minHeight	(minHeight)
	, m_maxWidth	(maxWidth)
	, m_maxHeight	(maxHeight)
	, m_use			(use)
{
	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));
}